

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BFTraceReader.cpp
# Opt level: O3

void __thiscall BFTraceReader::loadCFGs(BFTraceReader *this)

{
  bool bVar1;
  pointer pcVar2;
  Addr AVar3;
  string *psVar4;
  long *******ppppppplVar5;
  BFTraceReader *this_00;
  long *****ppppplVar6;
  int iVar7;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *this_01;
  anon_union_8_3_0f55d3ce_for_data *__s;
  CFG *this_02;
  long *plVar8;
  _List_node_base *p_Var9;
  mapped_type *pmVar10;
  CfgNode *this_03;
  BlockData *pBVar11;
  CfgNode *pCVar12;
  mapped_type *pmVar13;
  string *psVar14;
  _List_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  TerminatorType TVar17;
  size_type *psVar18;
  long ******pppppplVar19;
  long ******pppppplVar20;
  long *******ppppppplVar21;
  string keyword;
  Addr src;
  Addr dst;
  list<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_> symbols;
  undefined1 local_e0 [32];
  BFTraceReader *local_c0;
  long *****local_b8;
  anon_union_8_3_0f55d3ce_for_data local_b0 [2];
  _List_node_base local_a0;
  anon_union_8_3_0f55d3ce_for_data local_90;
  long ******local_88;
  long ******local_80;
  long local_78;
  _List_node_base *local_70;
  long *****local_68;
  long ******local_60;
  _Rb_tree_node_base *local_58;
  _Rb_tree_node_base *local_50;
  map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  *local_48;
  map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
  *local_40;
  string *local_38;
  
  local_88 = (long ******)&local_88;
  local_78 = 0;
  local_c0 = this;
  local_80 = local_88;
  if ((this->m_current).type == TKN_KEYWORD) {
    __s = (anon_union_8_3_0f55d3ce_for_data *)0x0;
    do {
      local_e0._0_8_ = local_e0 + 0x10;
      pcVar2 = (this->m_current).token._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e0,pcVar2,pcVar2 + (this->m_current).token._M_string_length);
      matchToken(this,TKN_KEYWORD);
      iVar7 = std::__cxx11::string::compare((char *)local_e0);
      if (iVar7 == 0) {
        __s = (anon_union_8_3_0f55d3ce_for_data *)operator_new(0xe8);
        memset(__s,0,0xd0);
        __s[2].addr = (Addr)(__s + 4);
        __s[4].boolean = false;
        __s[6].addr = (Addr)(__s + 8);
        __s[8].boolean = false;
        __s[0xd].addr = 0;
        __s[0xe].addr = (Addr)(__s + 0xc);
        __s[0xf].addr = (Addr)(__s + 0xc);
        *(undefined4 *)(__s + 0x12) = 0;
        __s[0x14].addr = (Addr)(__s + 0x12);
        __s[0x15].addr = (Addr)(__s + 0x12);
        *(undefined4 *)(__s + 0x18) = 0;
        __s[0x1a].addr = (Addr)(__s + 0x18);
        __s[0x1b].addr = (Addr)(__s + 0x18);
        __s[0x1c].addr = 0;
        p_Var9 = (_List_node_base *)operator_new(0x18);
        p_Var9[1]._M_next = (_List_node_base *)__s;
        std::__detail::_List_node_base::_M_hook(p_Var9);
        local_78 = local_78 + 1;
        *__s = (this->m_current).data;
        matchToken(this,TKN_ADDR);
        __s[1] = (this->m_current).data;
        matchToken(this,TKN_ADDR);
        std::__cxx11::string::_M_assign((string *)&__s[2].boolean);
        matchToken(this,TKN_STRING);
        std::__cxx11::string::_M_assign((string *)&__s[6].boolean);
        matchToken(this,TKN_STRING);
        __s[10] = (this->m_current).data;
        matchToken(this,TKN_ADDR);
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)local_e0);
        if (iVar7 == 0) {
          matchToken(this,TKN_ADDR);
          matchToken(this,TKN_ADDR);
          __s = (anon_union_8_3_0f55d3ce_for_data *)0x0;
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)local_e0);
          if (iVar7 == 0) {
            if (__s == (anon_union_8_3_0f55d3ce_for_data *)0x0) {
              __assert_fail("sym != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                            ,0x44,"virtual void BFTraceReader::loadCFGs()");
            }
            AVar3 = (this->m_current).data.addr;
            matchToken(this,TKN_ADDR);
            if (AVar3 != __s->addr) {
              __assert_fail("faddr == sym->start",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                            ,0x48,"virtual void BFTraceReader::loadCFGs()");
            }
            local_90 = (anon_union_8_3_0f55d3ce_for_data)(this->m_current).data.addr;
            matchToken(this,TKN_ADDR);
            pmVar10 = std::
                      map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                      ::operator[]((map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                                    *)(__s + 0xb),&local_90.addr);
            this_00 = local_c0;
            AVar3 = (local_c0->m_current).data.addr;
            matchToken(local_c0,TKN_ADDR);
            pmVar10->size = (int)AVar3 - local_90._0_4_;
            matchToken(this_00,TKN_ADDR);
            local_b0[0].addr = (Addr)&local_a0;
            pcVar2 = (this_00->m_current).token._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_b0,pcVar2,
                       pcVar2 + (this_00->m_current).token._M_string_length);
            matchToken(this_00,TKN_KEYWORD);
            iVar7 = std::__cxx11::string::compare((char *)&local_b0[0].addr);
            if (iVar7 == 0) {
              TVar17 = JUMP;
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)&local_b0[0].addr);
              if (iVar7 == 0) {
                TVar17 = CALL;
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)&local_b0[0].addr);
                if (iVar7 == 0) {
                  TVar17 = RETURN;
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)&local_b0[0].addr);
                  TVar17 = OTHER;
                  if (iVar7 != 0) {
                    __assert_fail("term_type == \"other\"",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                                  ,0x5d,"virtual void BFTraceReader::loadCFGs()");
                  }
                }
              }
            }
            pmVar10->type = TVar17;
            bVar1 = (local_c0->m_current).data.boolean;
            matchToken(local_c0,TKN_BOOL);
            if (bVar1 != false) {
              std::
              _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              ::_M_insert_unique<unsigned_long_const&>
                        ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                          *)&__s[0x17].boolean,&local_90.addr);
            }
            bVar1 = (local_c0->m_current).data.boolean;
            matchToken(local_c0,TKN_BOOL);
            pmVar10->is_exit = bVar1;
            this = local_c0;
            if (local_b0[0] != &local_a0) {
              operator_delete((void *)local_b0[0]);
              this = local_c0;
            }
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)local_e0);
            if ((iVar7 == 0) ||
               (iVar7 = std::__cxx11::string::compare((char *)local_e0), iVar7 == 0)) {
              matchToken(this,TKN_ADDR);
              matchToken(this,TKN_ADDR);
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)local_e0);
              if (iVar7 != 0) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                              ,0x7a,"virtual void BFTraceReader::loadCFGs()");
              }
              if (__s == (anon_union_8_3_0f55d3ce_for_data *)0x0) {
                __assert_fail("sym != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                              ,0x70,"virtual void BFTraceReader::loadCFGs()");
              }
              local_b0[0] = (this->m_current).data;
              matchToken(this,TKN_ADDR);
              local_90 = (this->m_current).data;
              matchToken(this,TKN_ADDR);
              this_01 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                         *)std::
                           map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                           ::operator[]((map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                                         *)(__s + 0x11),&local_b0[0].addr);
              std::
              _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              ::_M_insert_unique<unsigned_long_const&>(this_01,&local_90.addr);
            }
          }
        }
      }
      if ((string *)local_e0._0_8_ != (string *)(local_e0 + 0x10)) {
        operator_delete((void *)local_e0._0_8_);
      }
    } while ((this->m_current).type == TKN_KEYWORD);
  }
  matchToken(this,TKN_EOF);
  if ((long *******)local_88 != &local_88) {
    ppppppplVar21 = (long *******)local_88;
    do {
      local_b8 = (long *****)ppppppplVar21[2];
      p_Var16 = (_Rb_tree_node_base *)((long ******)local_b8)[0x1a];
      local_58 = (_Rb_tree_node_base *)((long ******)local_b8 + 0x18);
      local_60 = (long ******)ppppppplVar21;
      if (p_Var16 == local_58) {
LAB_0010c205:
        ppppplVar6 = local_b8;
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)(local_b8 + 0x17));
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                     *)(ppppplVar6 + 0x11));
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>,_std::_Select1st<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>,_std::_Select1st<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                     *)(ppppplVar6 + 0xb));
        if ((long *****)ppppplVar6[6] != ppppplVar6 + 8) {
          operator_delete(ppppplVar6[6]);
        }
        pppppplVar19 = (long ******)local_b8;
        if ((long *****)local_b8[2] != local_b8 + 4) {
          operator_delete(local_b8[2]);
        }
      }
      else {
        local_40 = (map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                    *)((long ******)local_b8 + 0xb);
        local_68 = (long *****)((long ******)local_b8 + 0xc);
        local_48 = (map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                    *)((long ******)local_b8 + 0x11);
        do {
          local_70 = *(_List_node_base **)(p_Var16 + 1);
          local_50 = p_Var16;
          this_02 = CFGReader::instance(&local_c0->super_CFGReader,(Addr)local_70);
          local_b0[0].addr = (Addr)&local_a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b0,local_b8[2],(long)local_b8[3] + (long)local_b8[2]);
          std::__cxx11::string::append((char *)&local_b0[0].addr);
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_b0[0].addr,(ulong)local_b8[6]);
          psVar18 = (size_type *)(plVar8 + 2);
          if ((size_type *)*plVar8 == psVar18) {
            local_e0._16_8_ = *psVar18;
            local_e0._24_8_ = plVar8[3];
            local_e0._0_8_ = local_e0 + 0x10;
          }
          else {
            local_e0._16_8_ = *psVar18;
            local_e0._0_8_ = (size_type *)*plVar8;
          }
          local_e0._8_8_ = plVar8[1];
          *plVar8 = (long)psVar18;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          CFG::setFunctionName(this_02,(string *)local_e0);
          if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
            operator_delete((void *)local_e0._0_8_);
          }
          if (local_b0[0] != &local_a0) {
            operator_delete((void *)local_b0[0]);
          }
          local_e0._16_8_ = 0;
          local_e0._0_8_ = (string *)local_e0;
          local_e0._8_8_ = (string *)local_e0;
          p_Var9 = (_List_node_base *)operator_new(0x18);
          p_Var9[1]._M_next = local_70;
          std::__detail::_List_node_base::_M_hook(p_Var9);
          local_e0._16_8_ = local_e0._16_8_ + 1;
          psVar14 = (string *)local_e0._0_8_;
          while (psVar14 != (string *)local_e0) {
            local_b0[0] = (anon_union_8_3_0f55d3ce_for_data)(psVar14->field_2)._M_allocated_capacity
            ;
            if ((_List_node_base *)local_b0[0].addr == (_List_node_base *)0x0) {
              __assert_fail("addr != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                            ,0x8a,"virtual void BFTraceReader::loadCFGs()");
            }
            pppppplVar19 = (long ******)((long ******)local_b8)[0xd];
            pppppplVar20 = (long ******)local_68;
            if (pppppplVar19 == (long ******)0x0) {
LAB_0010c297:
              __assert_fail("sym->blocks.find(addr) != sym->blocks.end()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                            ,0x8c,"virtual void BFTraceReader::loadCFGs()");
            }
            do {
              if ((_List_node_base *)pppppplVar19[4] >= local_b0[0].addr) {
                pppppplVar20 = pppppplVar19;
              }
              pppppplVar19 = (long ******)
                             pppppplVar19
                             [(ulong)((_List_node_base *)pppppplVar19[4] < local_b0[0].addr) + 2];
            } while (pppppplVar19 != (long ******)0x0);
            if ((pppppplVar20 == (long ******)local_68) ||
               (local_b0[0].addr < (_List_node_base *)pppppplVar20[4])) goto LAB_0010c297;
            pmVar10 = std::
                      map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                      ::operator[](local_40,&local_b0[0].addr);
            local_38 = psVar14;
            this_03 = CFG::nodeByAddr(this_02,local_b0[0].addr);
            if (this_03 == (CfgNode *)0x0) {
              this_03 = (CfgNode *)operator_new(0x18);
              CfgNode::CfgNode(this_03,CFG_BLOCK);
              pBVar11 = (BlockData *)operator_new(0x90);
              CfgNode::BlockData::BlockData(pBVar11,local_b0[0].addr,pmVar10->size,false);
              CfgNode::setData(this_03,(Data *)pBVar11);
              CFG::addNode(this_02,this_03);
            }
            else {
              if (this_03->m_type != CFG_PHANTOM) {
                __assert_fail("node->type() == CfgNode::CFG_PHANTOM",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                              ,0x95,"virtual void BFTraceReader::loadCFGs()");
              }
              pBVar11 = (BlockData *)operator_new(0x90);
              CfgNode::BlockData::BlockData(pBVar11,local_b0[0].addr,pmVar10->size,false);
              CfgNode::setData(this_03,(Data *)pBVar11);
            }
            if (local_b0[0] == local_70) {
              if (this_02->m_entryNode != (CfgNode *)0x0) {
                __assert_fail("cfg->entryNode() == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                              ,0x9a,"virtual void BFTraceReader::loadCFGs()");
              }
              pCVar12 = CFGReader::entryNode(this_02);
              CFG::addEdge(this_02,pCVar12,this_03,0);
            }
            if ((pmVar10->is_exit != false) || (pmVar10->type == RETURN)) {
              pCVar12 = CFGReader::exitNode(this_02);
              CFG::addEdge(this_02,this_03,pCVar12,0);
            }
            pmVar13 = std::
                      map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                      ::operator[](local_48,&local_b0[0].addr);
            for (p_Var16 = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var16 != &(pmVar13->_M_t)._M_impl.super__Rb_tree_header;
                p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
              p_Var9 = *(_List_node_base **)(p_Var16 + 1);
              pCVar12 = CFGReader::nodeWithAddr(this_02,(Addr)p_Var9);
              CFG::addEdge(this_02,this_03,pCVar12,0);
              for (psVar14 = (string *)local_e0._0_8_; psVar14 != (string *)local_e0;
                  psVar14 = (string *)(psVar14->_M_dataplus)._M_p) {
                if ((_List_node_base *)(psVar14->field_2)._M_allocated_capacity == p_Var9) {
                  if (psVar14 != (string *)local_e0) goto LAB_0010c18b;
                  break;
                }
              }
              p_Var15 = (_List_node_base *)operator_new(0x18);
              p_Var15[1]._M_next = p_Var9;
              std::__detail::_List_node_base::_M_hook(p_Var15);
              local_e0._16_8_ = local_e0._16_8_ + 1;
LAB_0010c18b:
            }
            psVar14 = (string *)(local_38->_M_dataplus)._M_p;
          }
          CFG::check(this_02);
          psVar14 = (string *)local_e0._0_8_;
          while (psVar14 != (string *)local_e0) {
            psVar4 = (string *)(psVar14->_M_dataplus)._M_p;
            operator_delete(psVar14);
            psVar14 = psVar4;
          }
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_50);
        } while (p_Var16 != local_58);
        pppppplVar19 = (long ******)local_b8;
        if ((long ******)local_b8 != (long ******)0x0) goto LAB_0010c205;
      }
      operator_delete(pppppplVar19);
      ppppppplVar21 = (long *******)*local_60;
    } while (ppppppplVar21 != &local_88);
  }
  ppppppplVar21 = (long *******)local_88;
  while (ppppppplVar21 != &local_88) {
    ppppppplVar5 = (long *******)*ppppppplVar21;
    operator_delete(ppppppplVar21);
    ppppppplVar21 = ppppppplVar5;
  }
  return;
}

Assistant:

void BFTraceReader::loadCFGs() {
	Symbol* sym = 0;
	std::list<Symbol*> symbols;

	while (m_current.type == InputTokenizer::Lexeme::TKN_KEYWORD) {
		std::string keyword = m_current.token;
		matchToken(InputTokenizer::Lexeme::TKN_KEYWORD);

		if (keyword == "symbol") {
			sym = new Symbol();
			symbols.push_back(sym);

			sym->start = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			sym->end = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			sym->filename = m_current.token;
			matchToken(InputTokenizer::Lexeme::TKN_STRING);

			sym->functname = m_current.token;
			matchToken(InputTokenizer::Lexeme::TKN_STRING);

			sym->bias = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
		} else if (keyword == "program-entry") {
			sym = 0;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
		} else if (keyword == "block") {
			assert(sym != 0);

			Addr faddr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			assert(faddr == sym->start);

			Addr bb_addr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			BasicBlock& bb = sym->blocks[bb_addr];

			Addr bb_end = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			bb.size = bb_end - bb_addr;

			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			std::string term_type = m_current.token;
			matchToken(InputTokenizer::Lexeme::TKN_KEYWORD);
			if (term_type == "jump")
				bb.type = BFTraceReader::JUMP;
			else if (term_type == "call")
				bb.type = BFTraceReader::CALL;
			else if (term_type == "return")
				bb.type = BFTraceReader::RETURN;
			else {
				assert(term_type == "other");
				bb.type = BFTraceReader::OTHER;
			}

			bool is_entry = m_current.data.boolean;
			matchToken(InputTokenizer::Lexeme::TKN_BOOL);
			if (is_entry)
				sym->entries.insert(bb_addr);

			bool is_exit = m_current.data.boolean;
			matchToken(InputTokenizer::Lexeme::TKN_BOOL);
			bb.is_exit = is_exit;
		} else if (keyword == "call") {
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
		} else if (keyword == "return") {
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
		} else if (keyword == "br") {
			assert(sym != 0);

			Addr src = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			Addr dst = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			sym->edges[src].insert(dst);
		} else {
			assert(false);
		}
	}

	matchToken(InputTokenizer::Lexeme::TKN_EOF);

	for (Symbol* sym : symbols) {
		for (Addr entry : sym->entries) {
			CFG* cfg = this->instance(entry);
			cfg->setFunctionName(sym->filename + "::" + sym->functname);

			std::list<Addr> nodes;
			nodes.push_back(entry);
			for (std::list<Addr>::iterator it = nodes.begin(), ed = nodes.end();
					it != ed; ++it) {
				Addr addr = *it;
				assert(addr != 0);

				assert(sym->blocks.find(addr) != sym->blocks.end());
				BasicBlock& bb = sym->blocks[addr];

				CfgNode* node = cfg->nodeByAddr(addr);
				if (node == 0) {
					node = new CfgNode(CfgNode::CFG_BLOCK);
					node->setData(new CfgNode::BlockData(addr, bb.size));
					cfg->addNode(node);
				} else {
					assert(node->type() == CfgNode::CFG_PHANTOM);
					node->setData(new CfgNode::BlockData(addr, bb.size));
				}

				if (addr == entry) {
					assert(cfg->entryNode() == 0);
					CfgNode* entry = CFGReader::entryNode(cfg);
					cfg->addEdge(entry, node);
				}

				if (bb.is_exit || bb.type == BFTraceReader::RETURN) {
					CfgNode* exit = CFGReader::exitNode(cfg);
					cfg->addEdge(node, exit);
				}

				for (Addr dst : sym->edges[addr]) {
					cfg->addEdge(node, CFGReader::nodeWithAddr(cfg, dst));

					if (std::find(nodes.begin(), ed, dst) == ed)
						nodes.push_back(dst);
				}
			}

			cfg->check();
		}

		delete sym;
	}
}